

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O1

shared_ptr<mocker::ast::ReturnStmt> __thiscall
mocker::Parser::returnStmt(Parser *this,TokIter *iter,TokIter end)

{
  Position end_00;
  pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> pVar1;
  pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> pVar2;
  size_t sVar3;
  TokenID TVar4;
  CompileError *this_00;
  Token *in_RCX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  Token *pTVar6;
  shared_ptr<mocker::ast::ReturnStmt> sVar7;
  Position beg;
  Position beg_00;
  Position beg_01;
  Position end_01;
  Position end_02;
  shared_ptr<mocker::ast::Expression> expr;
  pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType> local_68;
  size_t local_60;
  TokIter *local_58;
  shared_ptr<mocker::ast::Expression> *local_50;
  Parser local_48;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var5;
  
  Token::position(*end._M_current);
  sVar3 = local_60;
  pVar1 = local_68;
  _Var5._M_pi = extraout_RDX;
  if (*end._M_current != in_RCX) {
    TVar4 = Token::tokenID(*end._M_current);
    _Var5._M_pi = extraout_RDX_00;
    if (TVar4 == Return) {
      pTVar6 = (Token *)(*(long *)end._M_current + 0x38);
      *(Token **)end._M_current = pTVar6;
      if (pTVar6 != in_RCX) {
        TVar4 = Token::tokenID(pTVar6);
        if (TVar4 == Semicolon) {
          pTVar6 = *end._M_current;
          *(Token **)end._M_current = pTVar6 + 1;
          Token::position(pTVar6);
          local_48.tokBeg._M_current = (Token *)0x0;
          beg.col._0_4_ = local_68.first;
          beg.col._4_4_ = local_68.second;
          beg.line = (size_t)iter;
          end_01.col = (size_t)local_58;
          end_01.line = local_60;
          sVar7 = makeNode<mocker::ast::ReturnStmt,decltype(nullptr)>
                            (this,beg,end_01,(void **)local_50);
          _Var5 = sVar7.super___shared_ptr<mocker::ast::ReturnStmt,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi;
          goto LAB_00182565;
        }
      }
      local_68 = (pair<mocker::TokenID,_mocker::ast::BinaryExpr::OpType>)logicalOrExpr;
      local_60 = 0;
      local_48.pos = (unordered_map<unsigned_long,_std::pair<mocker::Position,_mocker::Position>,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>_>
                      *)0x2f;
      local_58 = iter;
      auxBinaryExpr<std::_Bind<std::shared_ptr<mocker::ast::Expression>(mocker::Parser::*(mocker::Parser*,std::_Placeholder<1>,std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>&,__gnu_cxx::__normal_iterator<mocker::Token_const*,std::vector<mocker::Token,std::allocator<mocker::Token>>>)>>
                (&local_48,iter,end,
                 (_Bind<std::shared_ptr<mocker::ast::Expression>_(mocker::Parser::*(mocker::Parser_*,_std::_Placeholder<1>,_std::_Placeholder<2>))(__gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>_&,___gnu_cxx::__normal_iterator<const_mocker::Token_*,_std::vector<mocker::Token,_std::allocator<mocker::Token>_>_>)>
                  *)in_RCX,&local_68);
      if (local_48.tokBeg._M_current == (Token *)0x0) {
LAB_0018262a:
        this_00 = (CompileError *)__cxa_allocate_exception(0x48);
        Token::position(*end._M_current);
        pVar2 = local_68;
        end_00.col = (size_t)local_50;
        end_00.line = (size_t)local_58;
        beg_01.col = sVar3;
        local_68.first = pVar1.first;
        local_68.second = pVar1.second;
        beg_01.line._0_4_ = local_68.first;
        beg_01.line._4_4_ = local_68.second;
        local_68 = pVar2;
        CompileError::CompileError(this_00,beg_01,end_00);
        *(undefined ***)this_00 = &PTR__CompileError_001f2a98;
        __cxa_throw(this_00,&SyntaxError::typeinfo,CompileError::~CompileError);
      }
      if (*end._M_current == in_RCX) {
        TVar4 = Error;
      }
      else {
        TVar4 = Token::tokenID(*end._M_current);
      }
      if (TVar4 != Semicolon) goto LAB_0018262a;
      pTVar6 = *end._M_current;
      *(Token **)end._M_current = pTVar6 + 1;
      Token::position(pTVar6);
      pVar2 = local_68;
      local_68.first = pVar1.first;
      local_68.second = pVar1.second;
      beg_00.col._0_4_ = local_68.first;
      beg_00.col._4_4_ = local_68.second;
      beg_00.line = (size_t)iter;
      end_02.col = (size_t)local_58;
      end_02.line = sVar3;
      local_68 = pVar2;
      sVar7 = makeNode<mocker::ast::ReturnStmt,std::shared_ptr<mocker::ast::Expression>&>
                        (this,beg_00,end_02,local_50);
      _Var5 = sVar7.super___shared_ptr<mocker::ast::ReturnStmt,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      if (local_48.tokEnd._M_current != (Token *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_48.tokEnd._M_current);
        _Var5._M_pi = extraout_RDX_01;
      }
      goto LAB_00182565;
    }
  }
  (this->tokBeg)._M_current = (Token *)0x0;
  (this->tokEnd)._M_current = (Token *)0x0;
LAB_00182565:
  sVar7.super___shared_ptr<mocker::ast::ReturnStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var5._M_pi;
  sVar7.super___shared_ptr<mocker::ast::ReturnStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::ReturnStmt>)
         sVar7.super___shared_ptr<mocker::ast::ReturnStmt,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::ReturnStmt> Parser::returnStmt(TokIter &iter,
                                                    TokIter end) {
  auto begPos = iter->position().first;

  auto id = GetTokenID(end);
  if (id(iter) != TokenID::Return)
    return nullptr;
  ++iter;
  if (id(iter) == TokenID::Semicolon)
    return makeNode<ast::ReturnStmt>(begPos, (iter++)->position().second,
                                     nullptr);
  auto expr = expression(iter, end);
  if (!expr || id(iter) != TokenID::Semicolon)
    throw SyntaxError(begPos, iter->position().second);
  return makeNode<ast::ReturnStmt>(begPos, (iter++)->position().second, expr);
}